

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::TZEnumeration::snext(TZEnumeration *this,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  TZEnumeration *this_local;
  
  UVar1 = ::U_SUCCESS(*status);
  if (((UVar1 == '\0') || (this->map == (int32_t *)0x0)) || (this->len <= this->pos)) {
    this_local = (TZEnumeration *)0x0;
  }
  else {
    getID(this,this->map[this->pos],status);
    this->pos = this->pos + 1;
    this_local = (TZEnumeration *)&(this->super_StringEnumeration).unistr;
  }
  return (UnicodeString *)this_local;
}

Assistant:

virtual const UnicodeString* snext(UErrorCode& status) {
        if (U_SUCCESS(status) && map != NULL && pos < len) {
            getID(map[pos], status);
            ++pos;
            return &unistr;
        }
        return 0;
    }